

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

bool __thiscall
teetime::Image::loadFromMemory(Image *this,uint8 *data,size_t dataSize,char *filename)

{
  char *pcVar1;
  Rgba *pRVar2;
  int comp;
  int height;
  int width;
  int local_104;
  int local_100;
  int local_fc;
  stbi__context local_f8;
  
  reset(this);
  init_stb();
  local_fc = 0;
  local_100 = 0;
  local_104 = 0;
  if (0x7ffffffe < dataSize) {
    __assert_fail("dataSize < INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                  ,0xa6,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)");
  }
  local_f8.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_f8.read_from_callbacks = 0;
  local_f8.img_buffer_end = data + dataSize;
  local_f8.img_buffer = data;
  local_f8.img_buffer_original = data;
  local_f8.img_buffer_original_end = local_f8.img_buffer_end;
  pRVar2 = (Rgba *)stbi__load_flip(&local_f8,&local_fc,&local_100,&local_104,4);
  if (pRVar2 != (Rgba *)0x0) {
    if ((long)local_fc < 1) {
      __assert_fail("width > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xaa,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if ((long)local_100 < 1) {
      __assert_fail("height > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xab,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if (local_104 < 1) {
      __assert_fail("comp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xac,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    this->m_data = pRVar2;
    this->m_width = (long)local_fc;
    this->m_height = (long)local_100;
    pcVar1 = (char *)(this->m_filename)._M_string_length;
    strlen(filename);
    std::__cxx11::string::_M_replace((ulong)&this->m_filename,0,pcVar1,(ulong)filename);
  }
  return pRVar2 != (Rgba *)0x0;
}

Assistant:

bool Image::loadFromMemory(const uint8* data, size_t dataSize, const char* filename)
{
  reset();

  init_stb();
  int width = 0;
  int height = 0;
  int comp = 0;

  assert(dataSize < INT_MAX);

  if (auto p = stbi_load_from_memory(data, static_cast<int>(dataSize), &width, &height, &comp, 4))
  {
    assert(width > 0);
    assert(height > 0);
    assert(comp > 0);

    m_data = (Image::Rgba*)p;
    m_width = width;
    m_height = height;
    m_filename = filename;

    return true;
  }

  return false;
}